

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O3

Status __thiscall leveldb::WriteBatch::Iterate(WriteBatch *this,Handler *handler)

{
  char cVar1;
  bool bVar2;
  _func_int **pp_Var3;
  Slice *msg2;
  long *in_RDX;
  Slice *msg;
  int iVar4;
  Slice key;
  Slice value;
  Slice local_80;
  Slice local_70;
  Slice local_60;
  Slice local_50;
  Slice local_40;
  
  if (handler[1]._vptr_Handler < (_func_int **)0xc) {
    msg = &local_80;
    local_80.data_ = "malformed WriteBatch (too small)";
    local_80.size_ = 0x20;
    msg2 = &local_50;
    local_50.data_ = "";
  }
  else {
    pp_Var3 = handler->_vptr_Handler;
    local_80.data_ = (char *)((long)pp_Var3 + 0xc);
    iVar4 = 0;
    local_50.data_ = "";
    local_50.size_ = 0;
    local_40.data_ = "";
    local_40.size_ = 0;
    local_80.size_ = (long)handler[1]._vptr_Handler - 0xc;
    if (local_80.size_ != 0) {
      iVar4 = 0;
      do {
        cVar1 = *local_80.data_;
        local_80.data_ = local_80.data_ + 1;
        local_80.size_ = local_80.size_ - 1;
        if (cVar1 != '\0') {
          if (cVar1 == '\x01') {
            bVar2 = GetLengthPrefixedSlice(&local_80,&local_50);
            if ((bVar2) && (bVar2 = GetLengthPrefixedSlice(&local_80,&local_40), bVar2)) {
              (**(code **)(*in_RDX + 0x10))();
              goto LAB_0011a5be;
            }
            local_60.data_ = "bad WriteBatch Put";
            local_60.size_ = 0x12;
          }
          else {
            local_60.data_ = "unknown WriteBatch tag";
            local_60.size_ = 0x16;
          }
LAB_0011a660:
          msg = &local_60;
          msg2 = &local_70;
          local_70.data_ = "";
          local_70.size_ = 0;
          goto LAB_0011a67b;
        }
        bVar2 = GetLengthPrefixedSlice(&local_80,&local_50);
        if (!bVar2) {
          local_60.data_ = "bad WriteBatch Delete";
          local_60.size_ = 0x15;
          goto LAB_0011a660;
        }
        (**(code **)(*in_RDX + 0x18))();
LAB_0011a5be:
        iVar4 = iVar4 + 1;
      } while (local_80.size_ != 0);
      pp_Var3 = handler->_vptr_Handler;
    }
    if (iVar4 == *(int *)(pp_Var3 + 1)) {
      (this->rep_)._M_dataplus._M_p = (pointer)0x0;
      return (Status)(char *)this;
    }
    msg = &local_60;
    local_60.data_ = "WriteBatch has wrong count";
    local_60.size_ = 0x1a;
    msg2 = &local_70;
    local_70.data_ = "";
  }
  msg2->size_ = 0;
LAB_0011a67b:
  Status::Status((Status *)this,kCorruption,msg,msg2);
  return (Status)(char *)this;
}

Assistant:

Status WriteBatch::Iterate(Handler* handler) const {
  Slice input(rep_);
  if (input.size() < kHeader) {
    return Status::Corruption("malformed WriteBatch (too small)");
  }

  input.remove_prefix(kHeader);
  Slice key, value;
  int found = 0;
  while (!input.empty()) {
    found++;
    char tag = input[0];
    input.remove_prefix(1);
    switch (tag) {
      case kTypeValue:
        if (GetLengthPrefixedSlice(&input, &key) &&
            GetLengthPrefixedSlice(&input, &value)) {
          handler->Put(key, value);
        } else {
          return Status::Corruption("bad WriteBatch Put");
        }
        break;
      case kTypeDeletion:
        if (GetLengthPrefixedSlice(&input, &key)) {
          handler->Delete(key);
        } else {
          return Status::Corruption("bad WriteBatch Delete");
        }
        break;
      default:
        return Status::Corruption("unknown WriteBatch tag");
    }
  }
  if (found != WriteBatchInternal::Count(this)) {
    return Status::Corruption("WriteBatch has wrong count");
  } else {
    return Status::OK();
  }
}